

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> *
dpfb::readCovarageTable
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          Stream *stream)

{
  StreamError *pSVar1;
  size_type sVar2;
  string local_80 [36];
  ushort local_5c;
  undefined1 local_59;
  string local_58 [4];
  uint16_t i;
  ushort local_36;
  uint16_t local_34;
  uint16_t local_32;
  uint16_t local_30;
  uint16_t endGlyphId;
  uint16_t startGlyphId;
  uint16_t rangeCount;
  uint16_t glyphCount;
  uint16_t local_1c;
  undefined1 local_19;
  uint16_t coverageFormat;
  Stream *pSStack_18;
  Stream *stream_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *result;
  
  local_19 = 0;
  pSStack_18 = stream;
  stream_local = (Stream *)__return_storage_ptr__;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(__return_storage_ptr__);
  local_1c = streams::Stream::readU16Be(pSStack_18);
  if (local_1c == 1) {
    endGlyphId = streams::Stream::readU16Be(pSStack_18);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (__return_storage_ptr__,(ulong)endGlyphId);
    while (endGlyphId != 0) {
      endGlyphId = endGlyphId - 1;
      local_30 = streams::Stream::readU16Be(pSStack_18);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (__return_storage_ptr__,&local_30);
    }
  }
  else {
    if (local_1c != 2) {
      pSVar1 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((char *)local_80,"Unknown format of coverage table: %u",(ulong)local_1c);
      streams::StreamError::runtime_error(pSVar1,local_80);
      __cxa_throw(pSVar1,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    local_32 = streams::Stream::readU16Be(pSStack_18);
    while (local_32 != 0) {
      local_32 = local_32 - 1;
      local_34 = streams::Stream::readU16Be(pSStack_18);
      local_36 = streams::Stream::readU16Be(pSStack_18);
      (*pSStack_18->_vptr_Stream[7])(pSStack_18,2,1);
      if (local_36 < local_34) {
        local_59 = 1;
        pSVar1 = (StreamError *)__cxa_allocate_exception(0x10);
        str::format_abi_cxx11_
                  ((char *)local_58,"Coverage table format 2 range start id (%u) > end id (%u)",
                   (ulong)local_34,(ulong)local_36);
        streams::StreamError::runtime_error(pSVar1,local_58);
        local_59 = 0;
        __cxa_throw(pSVar1,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
      }
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        (__return_storage_ptr__);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (__return_storage_ptr__,((sVar2 + local_36) - (ulong)local_34) + 1);
      for (local_5c = local_34; local_5c <= local_36; local_5c = local_5c + 1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (__return_storage_ptr__,&local_5c);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::uint16_t> readCovarageTable(Stream& stream)
{
    std::vector<std::uint16_t> result;

    const auto coverageFormat = stream.readU16Be();
    if (coverageFormat == 1) {
        auto glyphCount = stream.readU16Be();
        result.reserve(glyphCount);
        while (glyphCount--)
            result.push_back(stream.readU16Be());
    } else if (coverageFormat == 2) {
        auto rangeCount = stream.readU16Be();
        while (rangeCount--) {
            const auto startGlyphId = stream.readU16Be();
            const auto endGlyphId = stream.readU16Be();
            // Skip startCoverageIndex
            stream.seek(
                sizeof(std::uint16_t), SeekOrigin::cur);

            if (startGlyphId > endGlyphId)
                throw StreamError(str::format(
                    "Coverage table format 2 range start id "
                    "(%" PRIu16 ") > end id (%" PRIu16 ")",
                    startGlyphId,
                    endGlyphId));

            result.reserve(
                result.size() + endGlyphId - startGlyphId + 1);
            for (auto i = startGlyphId; i <= endGlyphId; ++ i)
                result.push_back(i);
        }
    } else
        throw StreamError(str::format(
            "Unknown format of coverage table: %" PRIu16,
            coverageFormat));

    return result;
}